

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerLdNativeCodeData(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  Opnd *pOVar4;
  undefined4 *puVar5;
  JITTimeWorkItem *this_00;
  CodeGenWorkItemIDL *pCVar6;
  MemRefOpnd *newSrc;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar4 = IR::Instr::GetSrc1(instr);
  if (pOVar4 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f44,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = Func::IsTopFunc(this->m_func);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f45,"(m_func->IsTopFunc())","m_func->IsTopFunc()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar1 = instr->m_prev;
  this_00 = Func::GetWorkItem(this->m_func);
  pCVar6 = JITTimeWorkItem::GetWorkItemData(this_00);
  newSrc = IR::MemRefOpnd::New((void *)pCVar6->nativeDataAddr,TyUint64,this->m_func,
                               AddrOpndKindDynamicNativeCodeDataRef);
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  LowererMD::ChangeToAssign(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLdNativeCodeData(IR::Instr * instr)
{
    Assert(!instr->GetSrc1());
    Assert(m_func->IsTopFunc());
    IR::Instr * instrPrev = instr->m_prev;
    instr->SetSrc1(IR::MemRefOpnd::New((void*)m_func->GetWorkItem()->GetWorkItemData()->nativeDataAddr, TyMachPtr, m_func, IR::AddrOpndKindDynamicNativeCodeDataRef));

    LowererMD::ChangeToAssign(instr);

    return instrPrev;
}